

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wave_header.cpp
# Opt level: O1

WaveHeader * cinemo::wh::parseWaveHeader(string *file)

{
  bitset<8UL> *pbVar1;
  size_t __n;
  int iVar2;
  WaveHeader *wh;
  long lVar3;
  long lVar4;
  header_pos hVar5;
  header_pos hVar6;
  header_pos hVar7;
  header_pos hVar8;
  ulong uVar9;
  size_t size;
  ifstream f;
  char buff [256];
  int *local_360;
  undefined8 local_358;
  int local_350;
  undefined1 local_34c;
  long local_340 [4];
  int aiStack_320 [122];
  int local_138 [66];
  
  std::ifstream::ifstream(local_340,(string *)file,_S_in|_S_bin|_S_ate);
  wh = (WaveHeader *)operator_new(0xa8);
  (wh->File)._M_dataplus._M_p = (pointer)&(wh->File).field_2;
  (wh->File)._M_string_length = 0;
  (wh->File).field_2._M_local_buf[0] = '\0';
  (wh->WaveId)._M_dataplus._M_p = (pointer)&(wh->WaveId).field_2;
  (wh->WaveId)._M_string_length = 0;
  (wh->WaveId).field_2._M_local_buf[0] = '\0';
  wh->HasFact = false;
  wh->ListSize = 0;
  (wh->WarningFlags).super__Base_bitset<1UL>._M_w = 0;
  (wh->ErrorFlags).super__Base_bitset<1UL>._M_w = 0;
  wh->FileSize = 0;
  wh->RiffSize = 0;
  wh->FormatSize = 0;
  wh->FormatAudioType = 0;
  wh->NumberOfChannels = 0;
  wh->SampleRate = 0;
  wh->ByteRate = 0;
  wh->BlockAlign = 0;
  wh->BitsPerSample = 0;
  wh->ExtensionSize = 0;
  wh->ValidBitsPerSample = 0;
  wh->ChannelMask = 0;
  wh->SubFormat[0] = '\0';
  wh->SubFormat[1] = '\0';
  wh->SubFormat[2] = '\0';
  wh->SubFormat[3] = '\0';
  wh->SubFormat[4] = '\0';
  wh->SubFormat[5] = '\0';
  wh->SubFormat[6] = '\0';
  wh->SubFormat[7] = '\0';
  wh->SubFormat[8] = '\0';
  wh->SubFormat[9] = '\0';
  wh->SubFormat[10] = '\0';
  wh->SubFormat[0xb] = '\0';
  *(undefined8 *)(wh->SubFormat + 0xc) = 0;
  wh->FactSampleLength = 0;
  wh->DataBegin = 0;
  *(undefined8 *)((long)&wh->DataBegin + 1) = 0;
  if (*(int *)((long)aiStack_320 + *(long *)(local_340[0] + -0x18)) == 0) {
    lVar3 = std::istream::tellg();
    std::__cxx11::string::_M_assign((string *)wh);
    wh->FileSize = (uint32_t)lVar3;
    if (lVar3 < 0x2c) {
      std::ifstream::close();
      *(byte *)&(wh->ErrorFlags).super__Base_bitset<1UL>._M_w =
           (byte)(wh->ErrorFlags).super__Base_bitset<1UL>._M_w | 2;
    }
    else {
      std::ios::clear((int)local_340 + (int)*(undefined8 *)(local_340[0] + -0x18));
      std::istream::seekg((long)local_340,_S_beg);
      std::istream::read((char *)local_340,(long)local_138);
      local_350 = local_138[0];
      local_358 = 4;
      local_34c = 0;
      local_360 = &local_350;
      if ((_DAT_0010d320 == 4) && (local_138[0] == *WaveRIFFString_abi_cxx11_)) {
        std::istream::read((char *)local_340,(long)&wh->RiffSize);
        pbVar1 = &wh->WarningFlags;
        if (wh->FileSize - wh->RiffSize != 8) {
          *(byte *)&(pbVar1->super__Base_bitset<1UL>)._M_w =
               (byte)(pbVar1->super__Base_bitset<1UL>)._M_w | 1;
        }
        std::istream::read((char *)local_340,(long)local_138);
        local_350 = local_138[0];
        local_358 = 4;
        local_34c = 0;
        local_360 = &local_350;
        std::__cxx11::string::operator=((string *)&wh->WaveId,(string *)&local_360);
        if (local_360 != &local_350) {
          operator_delete(local_360);
        }
        __n = (wh->WaveId)._M_string_length;
        uVar9 = 8;
        if ((__n == DAT_0010d340) &&
           ((__n == 0 ||
            (iVar2 = bcmp((wh->WaveId)._M_dataplus._M_p,WaveWaveIdString_abi_cxx11_,__n), iVar2 == 0
            )))) {
          lVar4 = std::istream::tellg();
          std::istream::read((char *)local_340,(long)local_138);
          lVar3 = std::istream::tellg();
          size = lVar3 - lVar4;
          hVar5 = searchForHeader((char *)local_138,size,(string *)WaveFormatString_abi_cxx11_);
          hVar6 = searchForHeader((char *)local_138,size,(string *)WaveFactString_abi_cxx11_);
          hVar7 = searchForHeader((char *)local_138,size,(string *)&WaveDataString_abi_cxx11_);
          hVar8 = searchForHeader((char *)local_138,size,(string *)WaveListString_abi_cxx11_);
          if (((ulong)hVar5 & 1) == 0) {
            *(byte *)&(wh->ErrorFlags).super__Base_bitset<1UL>._M_w =
                 (byte)(wh->ErrorFlags).super__Base_bitset<1UL>._M_w | 0x10;
          }
          if (((ulong)hVar7 & 1) == 0) {
            *(byte *)&(wh->ErrorFlags).super__Base_bitset<1UL>._M_w =
                 (byte)(wh->ErrorFlags).super__Base_bitset<1UL>._M_w | 0x20;
          }
          if ((wh->ErrorFlags).super__Base_bitset<1UL>._M_w == 0) {
            if ((((ulong)hVar6 & 1) != 0) || (((ulong)hVar8 & 1) != 0)) {
              *(byte *)&(pbVar1->super__Base_bitset<1UL>)._M_w =
                   (byte)(pbVar1->super__Base_bitset<1UL>)._M_w | 2;
            }
            uVar9 = (ulong)hVar6 >> 0x20;
            lVar4 = lVar4 + 4;
            if (((ulong)hVar6 & 1) != 0) {
              uVar9 = (ulong)(uint)(hVar6.second + (int)lVar4);
              wh->HasFact = true;
            }
            if (((ulong)hVar5 & 1) != 0) {
              getFmtFromFileHandle
                        (wh,(ifstream *)local_340,
                         (header_pos)
                         ((ulong)hVar5 & 0xff | (long)hVar5 + (lVar4 << 0x20) & 0xffffffff00000000U)
                        );
            }
            if (((ulong)hVar6 & 1) != 0) {
              getFactFromFileHandle
                        (wh,(ifstream *)local_340,(header_pos)((ulong)hVar6 & 0xff | uVar9 << 0x20))
              ;
            }
            if (((ulong)hVar7 & 1) != 0) {
              getDataFromFileHandle
                        (wh,(ifstream *)local_340,
                         (header_pos)
                         ((ulong)hVar7 & 0xff | (long)hVar7 + (lVar4 << 0x20) & 0xffffffff00000000U)
                        );
            }
            if (((ulong)hVar8 & 1) != 0) {
              wh->hasList = true;
            }
          }
          std::ifstream::close();
          goto LAB_00106bfb;
        }
      }
      else {
        uVar9 = 4;
        std::ifstream::close();
      }
      (wh->ErrorFlags).super__Base_bitset<1UL>._M_w =
           (wh->ErrorFlags).super__Base_bitset<1UL>._M_w | uVar9;
    }
  }
  else {
    *(byte *)&(wh->ErrorFlags).super__Base_bitset<1UL>._M_w =
         (byte)(wh->ErrorFlags).super__Base_bitset<1UL>._M_w | 1;
  }
LAB_00106bfb:
  std::ifstream::~ifstream(local_340);
  return wh;
}

Assistant:

WaveHeader* parseWaveHeader(const string& file) {

            std::ifstream f(file, std::ios::in | std::ios::binary |
                                  std::ios::ate);

            WaveHeader* const wh = new WaveHeader;

            if (!f || !f.good()) {
                wh->ErrorFlags.set(static_cast<int>(ERROR_FileIo), 1);
                return wh;
            }

            //Check for file size requirements
            long fSize = f.tellg(); //file is opened at the end
            wh->File = file;
            wh->FileSize = static_cast<uint32_t>(fSize);

            if (fSize < WaveMinLength) {
                f.close();
                wh->ErrorFlags.set(static_cast<int>(ERROR_FileTooSmall), 1);
                return wh; //because there is no point in reading rest of the file
            }

            //reset file handle (rewind)
            f.clear();
            f.seekg(0, std::ios::beg);

            char buff[WaveBufferSize]; //buffer for read operations

            //Check if file is RIFF
            f.read(&buff[0], 4); //get first 4 bytes
            if (string(&buff[0], 4) != WaveRIFFString) { //not valid
                f.close();
                wh->ErrorFlags.set(static_cast<int>(ERROR_NoRiffChunk), 1);
                return wh; //because there is no point in reading rest of the file
            }

            //RIFF Size (which should be (total file size - 8)
            //otherwise file might be corrupt
            f.read(reinterpret_cast<char*>(&wh->RiffSize), 4);
            if (wh->FileSize - wh->RiffSize != 8) {
                wh->WarningFlags.set(WARNING_SizeMismatch, 1); //just a warning
            }

            //extract "WAVE"
            f.read(&buff[0], 4);
            wh->WaveId = string(&buff[0], 4);
            if (wh->WaveId != WaveWaveIdString) {
                wh->ErrorFlags.set(static_cast<int>(ERROR_NoWaveChunk), 1);
                return wh; //because there is no point in reading rest of the file
            }

            //next might be "fmt " but there is no guarantee!
            long posBeforeHeaderSearch = static_cast<long>(f.tellg());
            header_pos fmt, fact, data, List;
            f.read(&buff[0], WaveBufferSize);
            size_t read = static_cast<size_t>(static_cast<long>(f.tellg()) -
                                              posBeforeHeaderSearch);
            //for fmt and fact there is no guranatee which comes first
            //so the search function is called twice
            fmt = searchForHeader(buff, read, WaveFormatString);
            fact = searchForHeader(buff, read, WaveFactString);
            //TODO search for data within fmt or fact search to speed up!
            data = searchForHeader(buff, read, WaveDataString);
            List = searchForHeader(buff, read, WaveListString);

            //fmt and data SHOULD be available, otherwise file is corrupted
            //fact is optional
            if (!fmt.first) {
                wh->ErrorFlags.set(static_cast<int>(ERROR_NoFmtChunk), 1);
            }

            if (!data.first) {
                wh->ErrorFlags.set(static_cast<int>(ERROR_NoDataChunk), 1);
            }

            if (wh->ErrorFlags.any()) {
                f.close();
                return wh; //to much errors! no point in reading rest of the file
            }

            posBeforeHeaderSearch += 4; //since all headers are 4 byte

            if (fact.first || List.first) {
                wh->WarningFlags.set(
                        static_cast<int>(WARNING_NoneStandardExtension), 1);
            }

            if (fact.first) {
                fact.second += posBeforeHeaderSearch;
                wh->HasFact = true; //set the flag
                //fact should be parsed after fmt
            }

            if (fmt.first) {
                fmt.second += posBeforeHeaderSearch;
                getFmtFromFileHandle(wh, f, fmt);
            }

            if (fact.first) {
                getFactFromFileHandle(wh, f, fact);
            }

            if (data.first) {
                data.second += posBeforeHeaderSearch;
                getDataFromFileHandle(wh, f, data);
            }

            if (List.first) {
                wh->hasList = true;
                getListInfoFromFileHandle(wh, f, List);
            }

            f.close();
            return wh;
        }